

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# definitions.hxx
# Opt level: O0

void __thiscall
stateObservation::
IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
::setValue(IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
           *this,Matrix<double,__1,_1,_0,__1,_1> *v,TimeIndex k)

{
  bool bVar1;
  Matrix<double,__1,_1,_0,__1,_1> *this_00;
  size_type sVar2;
  TimeIndex k_local;
  Matrix<double,__1,_1,_0,__1,_1> *v_local;
  IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
  *this_local;
  
  bVar1 = checkIndex(this,k);
  if (bVar1) {
    this_00 = operator[](this,k);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::operator=(this_00,v);
  }
  else {
    checkNext_(this,k);
    sVar2 = std::
            deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::size(&this->v_);
    if (sVar2 == 0) {
      this->k_ = k;
    }
    std::
    deque<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::push_back(&this->v_,v);
  }
  return;
}

Assistant:

inline void IndexedMatrixArrayT<MatrixType, Allocator >::setValue(const MatrixType& v,TimeIndex k)
{
    if (checkIndex(k))
    {
        (*this)[k]=v;
    }
    else
    {
        checkNext_(k);
        if (v_.size()==0)
            k_=k;

        v_.push_back(v);
    }
}